

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

void __thiscall duckdb_re2::Regexp::ParseState::DoConcatenation(ParseState *this)

{
  bool bVar1;
  RegexpOp op;
  void *pvVar2;
  ParseState *in_RDI;
  Regexp *in_stack_00000008;
  ParseState *in_stack_00000010;
  Regexp *re;
  Regexp *r1;
  RegexpOp in_stack_0000006c;
  ParseState *in_stack_00000070;
  
  if (in_RDI->stacktop_ != (Regexp *)0x0) {
    op = Regexp::op(in_RDI->stacktop_);
    bVar1 = IsMarker(in_RDI,op);
    if (!bVar1) goto LAB_0083be6a;
  }
  pvVar2 = operator_new(0x28);
  Regexp((Regexp *)in_RDI,(RegexpOp)((ulong)pvVar2 >> 0x20),(ParseFlags)pvVar2);
  PushRegexp(in_stack_00000010,in_stack_00000008);
LAB_0083be6a:
  DoCollapse(in_stack_00000070,in_stack_0000006c);
  return;
}

Assistant:

void Regexp::ParseState::DoConcatenation() {
  Regexp* r1 = stacktop_;
  if (r1 == NULL || IsMarker(r1->op())) {
    // empty concatenation is special case
    Regexp* re = new Regexp(kRegexpEmptyMatch, flags_);
    PushRegexp(re);
  }
  DoCollapse(kRegexpConcat);
}